

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thpool.c
# Opt level: O1

void thpool_destroy(thpool_ *thpool_p)

{
  int iVar1;
  long lVar2;
  double dVar3;
  int threads_total;
  time_t end;
  time_t start;
  time_t local_20;
  time_t local_18;
  
  if (thpool_p != (thpool_ *)0x0) {
    iVar1 = thpool_p->num_threads_alive;
    threads_keepalive = 0;
    time(&local_18);
    do {
      if (thpool_p->num_threads_alive == 0) break;
      bsem_post_all((thpool_p->jobqueue).has_jobs);
      time(&local_20);
      dVar3 = difftime(local_20,local_18);
    } while (dVar3 < 1.0);
    while (thpool_p->num_threads_alive != 0) {
      bsem_post_all((thpool_p->jobqueue).has_jobs);
      sleep(1);
    }
    jobqueue_destroy(&thpool_p->jobqueue);
    if (0 < iVar1) {
      lVar2 = 0;
      do {
        free(thpool_p->threads[lVar2]);
        lVar2 = lVar2 + 1;
      } while (lVar2 < iVar1);
    }
    free(thpool_p->threads);
    free(thpool_p);
  }
  return;
}

Assistant:

void thpool_destroy(thpool_* thpool_p){
	/* No need to destory if it's NULL */
	if (thpool_p == NULL) return ;

	volatile int threads_total = thpool_p->num_threads_alive;

	/* End each thread 's infinite loop */
	threads_keepalive = 0;

	/* Give one second to kill idle threads */
	double TIMEOUT = 1.0;
	time_t start, end;
	double tpassed = 0.0;
	time (&start);
	while (tpassed < TIMEOUT && thpool_p->num_threads_alive){
		bsem_post_all(thpool_p->jobqueue.has_jobs);
		time (&end);
		tpassed = difftime(end,start);
	}

	/* Poll remaining threads */
	while (thpool_p->num_threads_alive){
		bsem_post_all(thpool_p->jobqueue.has_jobs);
		sleep(1);
	}

	/* Job queue cleanup */
	jobqueue_destroy(&thpool_p->jobqueue);
	/* Deallocs */
	int n;
	for (n=0; n < threads_total; n++){
		thread_destroy(thpool_p->threads[n]);
	}
	free(thpool_p->threads);
	free(thpool_p);
}